

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O1

bool __thiscall
Diligent::VerifyResourceViewBinding<Diligent::BufferViewVkImpl,Diligent::BUFFER_VIEW_TYPE>
          (Diligent *this,PipelineResourceDesc *ResDesc,BindResourceInfo *BindInfo,
          BufferViewVkImpl *pViewImpl,initializer_list<Diligent::BUFFER_VIEW_TYPE> ExpectedViewTypes
          ,RESOURCE_DIMENSION ExpectedResourceDimension,bool IsMultisample,
          IDeviceObject *pCachedView,char *SignatureName)

{
  ostream *poVar1;
  BUFFER_VIEW_TYPE ViewType;
  BUFFER_VIEW_TYPE ViewType_00;
  char *__s;
  long lVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  iterator pBVar6;
  size_t sVar7;
  ostream *poVar8;
  Char *pCVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args;
  Uint32 ArrayIndex;
  iterator pBVar10;
  IDeviceObject *pCachedObject;
  undefined7 in_stack_00000011;
  stringstream ss;
  String local_218;
  undefined4 local_1f4;
  BufferViewVkImpl *local_1f0;
  Diligent *local_1e8;
  PipelineResourceDesc *local_1e0;
  Diligent local_1d8;
  undefined7 uStack_1d7;
  long local_1c8 [2];
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  pBVar10 = ExpectedViewTypes._M_array;
  local_1f4 = (undefined4)ExpectedViewTypes._M_len;
  pCachedObject = (IDeviceObject *)CONCAT71(in_stack_00000011,IsMultisample);
  local_1e8 = this;
  bVar4 = VerifyResourceBinding<Diligent::BufferViewVkImpl>
                    ("buffer view",(PipelineResourceDesc *)this,(BindResourceInfo *)ResDesc,
                     (BufferViewVkImpl *)BindInfo,pCachedObject,(char *)pCachedView);
  ArrayIndex = (Uint32)pCachedObject;
  if (BindInfo == (BindResourceInfo *)0x0) goto LAB_00256dc6;
  ViewType = *(BUFFER_VIEW_TYPE *)&BindInfo[1].pObject;
  local_1f0 = (BufferViewVkImpl *)BindInfo;
  if (pBVar10 == (iterator)0x0) {
LAB_00256abe:
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    poVar1 = (ostream *)(local_1b8 + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Error binding ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"buffer view",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," \'",2);
    __s = (local_1f0->super_BufferViewBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IBufferViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferViewDesc>
          .m_Desc.super_DeviceObjectAttribs.Name;
    iVar3 = (int)poVar1;
    if (__s == (char *)0x0) {
      std::ios::clear(iVar3 + (int)*(undefined8 *)(local_1a8[0]._M_allocated_capacity - 0x18));
    }
    else {
      sVar7 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\' to variable \'",0xf);
    GetShaderResourcePrintName_abi_cxx11_
              (&local_218,*(Diligent **)local_1e8,(char *)(ulong)*(uint *)(local_1e8 + 0xc),
               ResDesc->ArraySize,ArrayIndex);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(char *)CONCAT71(local_218._M_dataplus._M_p._1_7_,
                                                local_218._M_dataplus._M_p._0_1_),
                        local_218._M_string_length);
    local_1d8 = (Diligent)0x27;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_1d8,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_218._M_dataplus._M_p._1_7_,local_218._M_dataplus._M_p._0_1_) !=
        &local_218.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_218._M_dataplus._M_p._1_7_,local_218._M_dataplus._M_p._0_1_),
                      local_218.field_2._M_allocated_capacity + 1);
    }
    if (pCachedView != (IDeviceObject *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," defined by signature \'",0x17);
      sVar7 = strlen((char *)pCachedView);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)pCachedView,sVar7);
      local_218._M_dataplus._M_p._0_1_ = 0x27;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_218,1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,". Incorrect view type: ",0x17);
    local_1e0 = ResDesc;
    if (pBVar10 != (iterator)0x0) {
      bVar4 = true;
      pBVar6 = (iterator)0x0;
      do {
        ViewType_00 = pBVar6[(long)&pViewImpl->super_BufferViewBase<Diligent::EngineVkImplTraits>];
        if (!bVar4) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar1," or ",4);
        }
        pCVar9 = GetBufferViewTypeLiteralName(ViewType_00);
        if (pCVar9 == (Char *)0x0) {
          std::ios::clear(iVar3 + (int)*(undefined8 *)(local_1a8[0]._M_allocated_capacity - 0x18));
        }
        else {
          sVar7 = strlen(pCVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,pCVar9,sVar7);
        }
        pBVar6 = pBVar6 + 1;
        bVar4 = false;
      } while (pBVar10 != pBVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," is expected, ",0xe);
    pCVar9 = GetBufferViewTypeLiteralName(ViewType);
    if (pCVar9 == (Char *)0x0) {
      std::ios::clear(iVar3 + (int)*(undefined8 *)(local_1a8[0]._M_allocated_capacity - 0x18));
    }
    else {
      sVar7 = strlen(pCVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,pCVar9,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," is provided.",0xd);
    std::__cxx11::stringbuf::str();
    FormatString<std::__cxx11::string>(&local_218,&local_1d8,Args);
    ResDesc = local_1e0;
    if ((long *)CONCAT71(uStack_1d7,local_1d8) != local_1c8) {
      operator_delete((long *)CONCAT71(uStack_1d7,local_1d8),local_1c8[0] + 1);
    }
    DebugAssertionFailed
              ((Char *)CONCAT71(local_218._M_dataplus._M_p._1_7_,local_218._M_dataplus._M_p._0_1_),
               "VerifyResourceViewBinding",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0x1bf);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_218._M_dataplus._M_p._1_7_,local_218._M_dataplus._M_p._0_1_) !=
        &local_218.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_218._M_dataplus._M_p._1_7_,local_218._M_dataplus._M_p._0_1_),
                      local_218.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
    bVar4 = false;
  }
  else {
    pBVar6 = (iterator)0x0;
    bVar5 = false;
    do {
      if (pBVar6[(long)&pViewImpl->super_BufferViewBase<Diligent::EngineVkImplTraits>] == ViewType)
      {
        bVar5 = true;
      }
      pBVar6 = pBVar6 + 1;
    } while (pBVar10 != pBVar6);
    if (!bVar5) goto LAB_00256abe;
  }
  bVar5 = ValidateResourceViewDimension<Diligent::BufferViewVkImpl>
                    (*(char **)local_1e8,*(Uint32 *)(local_1e8 + 0xc),ResDesc->ArraySize,local_1f0,
                     (RESOURCE_DIMENSION)local_1f4,(bool)ExpectedResourceDimension);
  bVar4 = (bool)(bVar5 & bVar4);
LAB_00256dc6:
  lVar2._0_1_ = ResDesc->ResourceType;
  lVar2._1_1_ = ResDesc->VarType;
  lVar2._2_1_ = ResDesc->Flags;
  lVar2._3_1_ = ResDesc->field_0x13;
  lVar2._4_1_ = (ResDesc->WebGPUAttribs).BindingType;
  lVar2._5_1_ = (ResDesc->WebGPUAttribs).TextureViewDim;
  lVar2._6_2_ = (ResDesc->WebGPUAttribs).UAVTextureFormat;
  if (ResDesc[1].Name != (Char *)0x0 || lVar2 != 0) {
    FormatString<char[132]>
              ((string *)local_1b8,
               (char (*) [132])
               "Buffer range may only be directly specified for constant buffers. To specify a range for a structured buffer, create a buffer view."
              );
    DebugAssertionFailed
              ((Char *)local_1b8._0_8_,"VerifyResourceViewBinding",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0x1cd);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
    }
  }
  return bVar4;
}

Assistant:

bool VerifyResourceViewBinding(const PipelineResourceDesc&             ResDesc,
                               const BindResourceInfo&                 BindInfo,
                               const ResourceViewImplType*             pViewImpl,
                               std::initializer_list<ViewTypeEnumType> ExpectedViewTypes,
                               RESOURCE_DIMENSION                      ExpectedResourceDimension,
                               bool                                    IsMultisample,
                               const IDeviceObject*                    pCachedView,
                               const char*                             SignatureName)
{
    const char* ExpectedResourceType = GetResourceTypeName<ViewTypeEnumType>();

    bool BindingOK = VerifyResourceBinding(ExpectedResourceType, ResDesc, BindInfo, pViewImpl, pCachedView, SignatureName);

    if (pViewImpl)
    {
        ViewTypeEnumType ViewType           = pViewImpl->GetDesc().ViewType;
        bool             IsExpectedViewType = false;
        for (ViewTypeEnumType ExpectedViewType : ExpectedViewTypes)
        {
            if (ExpectedViewType == ViewType)
                IsExpectedViewType = true;
        }

        if (!IsExpectedViewType)
        {
            std::stringstream ss;
            ss << "Error binding " << ExpectedResourceType << " '" << pViewImpl->GetDesc().Name << "' to variable '"
               << GetShaderResourcePrintName(ResDesc, BindInfo.ArrayIndex) << '\'';
            if (SignatureName != nullptr)
            {
                ss << " defined by signature '" << SignatureName << '\'';
            }
            ss << ". Incorrect view type: ";
            bool IsFirstViewType = true;
            for (ViewTypeEnumType ExpectedViewType : ExpectedViewTypes)
            {
                if (!IsFirstViewType)
                {
                    ss << " or ";
                }
                ss << GetViewTypeLiteralName(ExpectedViewType);
                IsFirstViewType = false;
            }
            ss << " is expected, " << GetViewTypeLiteralName(ViewType) << " is provided.";
            RESOURCE_VALIDATION_FAILURE(ss.str());

            BindingOK = false;
        }

        if (!ValidateResourceViewDimension(ResDesc.Name, ResDesc.ArraySize, BindInfo.ArrayIndex, pViewImpl, ExpectedResourceDimension, IsMultisample))
        {
            BindingOK = false;
        }
    }

    if (BindInfo.BufferBaseOffset != 0 || BindInfo.BufferRangeSize != 0)
    {
        RESOURCE_VALIDATION_FAILURE("Buffer range may only be directly specified for constant buffers. "
                                    "To specify a range for a structured buffer, create a buffer view.");
    }

    return BindingOK;
}